

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void write_cb(Fl_Widget *param_1,void *param_2)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  char cname [2048];
  char hname [2048];
  char acStack_1820 [2048];
  code *pcStack_1020;
  char acStack_1018 [2048];
  char local_818 [2056];
  
  if (filename == (char *)0x0) {
    pcStack_1020 = (code *)0x199f1d;
    save_cb((Fl_Widget *)0x0,(void *)0x0);
    if (filename == (char *)0x0) {
      return;
    }
  }
  pcStack_1020 = (code *)0x199f32;
  pcVar3 = fl_filename_name(filename);
  pcStack_1020 = (code *)0x199f49;
  fl_strlcpy(i18n_program,pcVar3,0x800);
  pcStack_1020 = (code *)0x199f5d;
  fl_filename_setext(i18n_program,0x800,"");
  pcVar3 = code_file_name;
  if (*code_file_name == '.') {
    pcStack_1020 = (code *)0x199f76;
    pcVar4 = strchr(code_file_name,0x2f);
    if (pcVar4 != (char *)0x0) goto LAB_00199f7f;
    pcStack_1020 = (code *)0x19a073;
    pcVar3 = fl_filename_name(filename);
    pcStack_1020 = (code *)0x19a086;
    fl_strlcpy(acStack_1018,pcVar3,0x800);
    pcStack_1020 = (code *)0x19a09a;
    fl_filename_setext(acStack_1018,0x800,code_file_name);
  }
  else {
LAB_00199f7f:
    pcStack_1020 = (code *)0x199f8f;
    fl_strlcpy(acStack_1018,pcVar3,0x800);
  }
  pcVar3 = header_file_name;
  if (*header_file_name == '.') {
    pcStack_1020 = (code *)0x199fa8;
    pcVar4 = strchr(header_file_name,0x2f);
    if (pcVar4 == (char *)0x0) {
      pcStack_1020 = (code *)0x19a0ab;
      pcVar3 = fl_filename_name(filename);
      pcStack_1020 = (code *)0x19a0c3;
      fl_strlcpy(local_818,pcVar3,0x800);
      pcStack_1020 = (code *)0x19a0d7;
      fl_filename_setext(local_818,0x800,header_file_name);
      goto LAB_00199fc6;
    }
  }
  pcStack_1020 = (code *)0x199fc6;
  fl_strlcpy(local_818,pcVar3,0x800);
LAB_00199fc6:
  if (batch_mode == 0) {
    pcStack_1020 = (code *)0x199fd4;
    goto_source_dir();
  }
  pcStack_1020 = (code *)0x199fe4;
  uVar1 = write_code(acStack_1018,local_818);
  if (batch_mode == 0) {
    pcStack_1020 = (code *)0x199ff4;
    leave_source_dir();
  }
  pcStack_1020 = (code *)0x19a00b;
  fl_strlcat(acStack_1018," and ",0x800);
  pcStack_1020 = (code *)0x19a020;
  fl_strlcat(acStack_1018,local_818,0x800);
  if (batch_mode == 0) {
    if (uVar1 == 0) {
      pcStack_1020 = (code *)0x19a0e1;
      piVar5 = __errno_location();
      pcStack_1020 = (code *)0x19a0e8;
      pcVar3 = strerror(*piVar5);
      pcStack_1020 = (code *)0x19a0fc;
      fl_message("Can\'t write %s: %s",acStack_1018,pcVar3);
    }
    else if ((completion_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0') {
      pcStack_1020 = (code *)0x19a065;
      fl_message("Wrote %s",acStack_1018);
    }
    return;
  }
  if (uVar1 != 0) {
    return;
  }
  pcStack_1020 = write_strings_cb;
  write_cb();
  pcStack_1020 = (code *)(ulong)uVar1;
  if ((filename == (char *)0x0) && (save_cb((Fl_Widget *)0x0,(void *)0x0), filename == (char *)0x0))
  {
    return;
  }
  pcVar3 = fl_filename_name(filename);
  fl_strlcpy(acStack_1820,pcVar3,0x800);
  fl_filename_setext(acStack_1820,0x800,
                     _ZZ16write_strings_cbP9Fl_WidgetPvE4exts_rel +
                     *(int *)(_ZZ16write_strings_cbP9Fl_WidgetPvE4exts_rel + (long)i18n_type * 4));
  if (batch_mode == 0) {
    goto_source_dir();
  }
  iVar2 = write_strings(acStack_1820);
  if ((batch_mode == 0) && (leave_source_dir(), batch_mode == 0)) {
    if (iVar2 != 0) {
      piVar5 = __errno_location();
      pcVar3 = strerror(*piVar5);
      fl_message("Can\'t write %s: %s",acStack_1820,pcVar3);
      return;
    }
    if ((completion_button->super_Fl_Light_Button).super_Fl_Button.value_ == '\0') {
      return;
    }
    fl_message("Wrote %s",acStack_1820);
    return;
  }
  if (iVar2 == 0) {
    return;
  }
  write_strings_cb();
  if (Fl_Type::current == (Fl_Type *)0x0) {
    fl_message("Please select a widget");
    return;
  }
  (*Fl_Type::current->_vptr_Fl_Type[0xb])();
  return;
}

Assistant:

void write_cb(Fl_Widget *, void *) {
  if (!filename) {
    save_cb(0,0);
    if (!filename) return;
  }
  char cname[FL_PATH_MAX];
  char hname[FL_PATH_MAX];
  strlcpy(i18n_program, fl_filename_name(filename), sizeof(i18n_program));
  fl_filename_setext(i18n_program, sizeof(i18n_program), "");
  if (*code_file_name == '.' && strchr(code_file_name, '/') == NULL) {
    strlcpy(cname, fl_filename_name(filename), sizeof(cname));
    fl_filename_setext(cname, sizeof(cname), code_file_name);
  } else {
    strlcpy(cname, code_file_name, sizeof(hname));
  }
  if (*header_file_name == '.' && strchr(header_file_name, '/') == NULL) {
    strlcpy(hname, fl_filename_name(filename), sizeof(hname));
    fl_filename_setext(hname, sizeof(hname), header_file_name);
  } else {
    strlcpy(hname, header_file_name, sizeof(hname));
  }
  if (!batch_mode) goto_source_dir();
  int x = write_code(cname,hname);
  if (!batch_mode) leave_source_dir();
  strlcat(cname, " and ", sizeof(cname));
  strlcat(cname, hname, sizeof(cname));
  if (batch_mode) {
    if (!x) {fprintf(stderr,"%s : %s\n",cname,strerror(errno)); exit(1);}
  } else {
    if (!x) {
      fl_message("Can't write %s: %s", cname, strerror(errno));
    } else if (completion_button->value()) {
      fl_message("Wrote %s", cname);
    }
  }
}